

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float16 float16_muladd_sparc64(float16 a,float16 b,float16 c,int flags,float_status *status)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  undefined4 in_register_0000000c;
  uint uVar9;
  int count;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint64_t a1;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  FloatParts FVar22;
  FloatParts FVar23;
  FloatParts FVar24;
  FloatParts p;
  FloatParts b_00;
  FloatParts a_00;
  uint64_t hi;
  uint64_t c_lo;
  uint64_t c_hi;
  float_status *in_stack_ffffffffffffff90;
  ulong local_68;
  uint local_5c;
  uint64_t local_58;
  ulong local_50;
  ulong local_48;
  uint64_t local_40;
  ulong local_38;
  uint uVar5;
  
  local_50 = CONCAT44(in_register_0000000c,flags);
  FVar22._8_8_ = (ulong)(a >> 10 & 0x1f) | (ulong)(a & 0x8000) << 0x19;
  FVar22.frac = (ulong)(a & 0x3ff);
  FVar22 = sf_canonicalize(FVar22,&float16_params,status);
  uVar10 = FVar22._8_8_;
  local_58 = FVar22.frac;
  FVar23.frac = (ulong)(b & 0x3ff);
  FVar23._8_8_ = (ulong)(b >> 10 & 0x1f) | (ulong)(b & 0x8000) << 0x19;
  FVar23 = sf_canonicalize(FVar23,&float16_params,status);
  local_48 = FVar23.frac;
  FVar24._8_8_ = (ulong)(c >> 10 & 0x1f) | (ulong)(c & 0x8000) << 0x19;
  FVar24.frac = (ulong)(c & 0x3ff);
  FVar24 = sf_canonicalize(FVar24,&float16_params,status);
  uVar14 = FVar24.frac;
  if (((((undefined1  [16])FVar22 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0) ||
      (((undefined1  [16])FVar23 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0)) ||
     (((undefined1  [16])FVar24 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0)) {
    uVar14 = FVar23._8_8_ & 0xffffffffffff;
    b_00.exp = (int)uVar14;
    b_00.cls = (char)(uVar14 >> 0x20);
    b_00.sign = (_Bool)(char)(uVar14 >> 0x28);
    b_00._14_2_ = (short)(uVar14 >> 0x30);
    b_00.frac = local_48;
    a_00.exp = (int)uVar10;
    a_00.cls = (char)(uVar10 >> 0x20);
    a_00.sign = (_Bool)(char)(uVar10 >> 0x28);
    a_00._14_2_ = (short)(uVar10 >> 0x30);
    a_00.frac = local_58;
    p = pick_nan_muladd(a_00,b_00,FVar24,SUB81(status,0),in_stack_ffffffffffffff90);
    goto LAB_00a2051d;
  }
  uVar8 = FVar23._12_4_ & 0xff;
  uVar9 = FVar22._12_4_ & 0xff;
  if ((1 << (FVar23.cls & 0x1f) | 1 << (FVar22._12_4_ & 0x1f)) != 10) {
    uVar15 = 0x10000000000;
    uVar13 = (uint)local_50;
    uVar19 = FVar24._8_8_ & 0xffff0103ffffffff ^ 0x10000000000;
    if ((local_50 & 1) == 0) {
      uVar19 = FVar24._8_8_;
    }
    uVar6 = (FVar23._8_8_ ^ uVar10) & 0x10000000000;
    uVar17 = (ulong)(uVar6 == 0);
    if ((local_50 & 2) == 0) {
      uVar17 = uVar6 >> 0x28;
    }
    uVar16 = (uint)uVar17;
    bVar20 = uVar9 != 3;
    bVar21 = uVar8 != 3;
    uVar12 = uVar13 & 4;
    uVar5 = (uint)(uVar19 >> 0x20);
    uVar4 = uVar5 & 3;
    if (uVar4 != 3) {
      if (!bVar21 || !bVar20) {
        if (uVar12 >> 2 == uVar16) {
          uVar15 = 0;
        }
        goto LAB_00a20508;
      }
      uVar18 = (uint)uVar19;
      if ((bVar21 && bVar20) && (uVar8 == 1 || uVar9 == 1)) {
        if (uVar4 == 1) {
          if ((uVar5 >> 8 & 1) != uVar16) {
            uVar17 = (ulong)(status->float_rounding_mode == '\x01');
          }
          uVar19 = uVar19 & 0xffff0003ffffffff | uVar17 << 0x28;
        }
        else if ((local_50 & 8) != 0) {
          uVar19 = uVar19 & 0xffffff0300000000 | (ulong)(uVar18 - 1);
        }
        if (((uint)(uVar19 >> 0x28) & 1) == uVar12 >> 2) {
          uVar15 = 0;
        }
        uVar15 = uVar19 & 0xffff00ffffffffff | uVar15;
        p.exp = (int)uVar15;
        p.cls = (char)(uVar15 >> 0x20);
        p.sign = (_Bool)(char)(uVar15 >> 0x28);
        p._14_2_ = (short)(uVar15 >> 0x30);
        p.frac = uVar14;
        goto LAB_00a2051d;
      }
      local_5c = uVar12;
      if ((uVar9 != 2) || (uVar8 != 2)) {
        __assert_fail("a.cls == float_class_normal && b.cls == float_class_normal",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                      ,0x58e,
                      "FloatParts muladd_floats(FloatParts, FloatParts, FloatParts, int, float_status *)"
                     );
      }
      uVar15 = (local_58 & 0xffffffff) * (local_48 >> 0x20);
      uVar6 = (local_48 & 0xffffffff) * (local_58 >> 0x20);
      uVar11 = uVar6 + uVar15;
      a1 = local_48 * local_58;
      local_68 = (uVar11 >> 0x20) + (local_48 >> 0x20) * (local_58 >> 0x20) +
                 ((ulong)CARRY8(uVar6,uVar15) << 0x20) + (ulong)(a1 < uVar11 << 0x20);
      uVar8 = FVar23.exp + FVar22.exp;
      if ((local_68 >> 0x3d & 1) != 0) {
        a1 = (ulong)((uint)a1 & 1) | local_68 << 0x3f | a1 >> 1;
        local_68 = local_68 >> 1;
        uVar8 = uVar8 + 1;
      }
      if (uVar4 == 1) {
        uVar15 = (ulong)((a1 & 0x3fffffffffffffff) != 0) | local_68 << 2 | a1 >> 0x3e;
        local_68 = local_68 >> 0x3e;
      }
      else {
        count = uVar8 - uVar18;
        if ((uVar5 >> 8 & 1) == uVar16) {
          if (count < 1) {
            uVar15 = a1;
            shift128RightJamming
                      (local_68,a1,0x3e - count,&local_68,(uint64_t *)&stack0xffffffffffffff90);
            uVar15 = uVar15 + uVar14;
          }
          else {
            local_38 = uVar14 >> 2;
            local_40 = 0;
            shift128RightJamming(local_38,0,count,&local_38,&local_40);
            local_68 = local_38 + local_68 + (ulong)CARRY8(local_40,a1);
            a1 = (ulong)((local_40 + a1 & 0x3fffffffffffffff) != 0) |
                 local_68 * 4 | local_40 + a1 >> 0x3e;
            local_68 = local_68 >> 0x3e;
            uVar19 = (ulong)uVar8;
            uVar15 = a1;
          }
          uVar8 = (uint)uVar19;
          bVar20 = true;
          uVar13 = (uint)local_50;
          if ((long)uVar15 < 0) {
            uVar15 = (ulong)((uint)uVar15 & 1) | uVar15 >> 1;
            uVar8 = uVar8 + 1;
          }
        }
        else {
          uVar14 = uVar14 >> 2;
          local_40 = 0;
          local_38 = uVar14;
          if (count < 1) {
            shift128RightJamming(local_68,a1,-count,&local_68,(uint64_t *)&stack0xffffffffffffff90);
            if ((uVar8 == uVar18) && (uVar15 = a1, uVar6 = local_68 - uVar14, uVar14 <= local_68))
            goto LAB_00a207a5;
            uVar15 = -a1;
            local_68 = (uVar14 - local_68) - (ulong)(a1 != 0);
            uVar16 = (uint)(byte)((byte)uVar17 ^ 1);
          }
          else {
            shift128RightJamming(uVar14,0,count,&local_38,&local_40);
            uVar15 = a1 - local_40;
            uVar6 = (local_68 - local_38) - (ulong)(a1 < local_40);
LAB_00a207a5:
            local_68 = uVar6;
            uVar19 = (ulong)uVar8;
          }
          uVar8 = (uint)uVar19;
          bVar20 = local_68 != 0 || uVar15 != 0;
          uVar13 = (uint)local_50;
          if (local_68 == 0 && uVar15 == 0) {
            uVar14 = 0;
            if (local_5c >> 2 != (uint)(status->float_rounding_mode == '\x01')) {
              uVar14 = 0x10000000000;
            }
            uVar10 = uVar10 & 0xffff0000ffffffff | 0x100000000 | uVar14;
            a1 = uVar10;
          }
          else {
            lVar1 = 0x3f;
            if (local_68 != 0) {
              for (; local_68 >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            if (uVar15 == 0) {
              uVar9 = 0x40;
            }
            else {
              lVar2 = 0x3f;
              if (uVar15 != 0) {
                for (; uVar15 >> lVar2 == 0; lVar2 = lVar2 + -1) {
                }
              }
              uVar9 = (uint)lVar2 ^ 0x3f;
            }
            uVar4 = (uint)lVar1 ^ 0x3f;
            if (local_68 == 0) {
              uVar4 = uVar9 + 0x40;
            }
            if (uVar4 < 0x41) {
              bVar7 = (char)uVar4 - 1;
              bVar3 = bVar7 & 0x3f;
              local_68 = local_68 << bVar3 | uVar15 >> 0x40 - bVar3;
              uVar15 = uVar15 << (bVar7 & 0x3f) != 0 | local_68;
            }
            else {
              uVar15 = uVar15 << ((char)uVar4 + 0xbfU & 0x3f);
            }
            uVar8 = (uVar8 - uVar4) + 3;
            a1 = uVar15;
          }
        }
        p.exp = (int)a1;
        p.cls = (char)(a1 >> 0x20);
        p.sign = (_Bool)(char)(a1 >> 0x28);
        p._14_2_ = (short)(a1 >> 0x30);
        p.frac = local_58;
        if (!bVar20) goto LAB_00a2051d;
      }
      uVar14 = 0x10000000000;
      if (local_5c >> 2 == uVar16) {
        uVar14 = 0;
      }
      uVar14 = (ulong)(((int)(uVar13 << 0x1c) >> 0x1f) + uVar8) | uVar10 & 0xffff000000000000 |
               uVar14 | 0x200000000;
      p.exp = (int)uVar14;
      p.cls = (char)(uVar14 >> 0x20);
      p.sign = (_Bool)(char)(uVar14 >> 0x28);
      p._14_2_ = (short)(uVar14 >> 0x30);
      p.frac = uVar15;
      goto LAB_00a2051d;
    }
    if ((bVar21 && bVar20) || ((uVar5 >> 8 & 1) == uVar16)) {
      if ((uVar5 >> 8 & 1) == uVar12 >> 2) {
        uVar15 = 0;
      }
LAB_00a20508:
      uVar15 = uVar10 & 0xffff0000ffffffff | 0x300000000 | uVar15;
      p.exp = (int)uVar15;
      p.cls = (char)(uVar15 >> 0x20);
      p.sign = (_Bool)(char)(uVar15 >> 0x28);
      p._14_2_ = (short)(uVar15 >> 0x30);
      p.frac = local_58;
      goto LAB_00a2051d;
    }
  }
  p.exp = 0x7fffffff;
  p.cls = float_class_qnan;
  p.sign = false;
  p._14_2_ = 0;
  p.frac = 0x3fffffffffffffff;
  status->float_exception_flags = status->float_exception_flags | 1;
LAB_00a2051d:
  FVar22 = round_canonical(p,status,&float16_params);
  return (ushort)FVar22.frac & 0x3ff | (ushort)((FVar22.exp & 0x1fU) << 10) |
         (ushort)(FVar22._8_8_ >> 0x19) & 0x8000;
}

Assistant:

float16 QEMU_FLATTEN float16_muladd(float16 a, float16 b, float16 c,
                                                int flags, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pc = float16_unpack_canonical(c, status);
    FloatParts pr = muladd_floats(pa, pb, pc, flags, status);

    return float16_round_pack_canonical(pr, status);
}